

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O0

natwm_error color_theme_from_config(map *map,char *key,color_theme **result)

{
  natwm_error nVar1;
  color_theme *theme_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar2;
  color_theme *theme;
  config_array *pcStack_30;
  natwm_error err;
  config_array *config_value;
  color_theme **result_local;
  char *key_local;
  map *map_local;
  
  uVar2 = 0x104899;
  pcStack_30 = (config_array *)0x0;
  config_value = (config_array *)result;
  result_local = (color_theme **)key;
  key_local = (char *)map;
  nVar1 = config_find_array(map,key,&stack0xffffffffffffffd0);
  if (nVar1 == NO_ERROR) {
    if (pcStack_30->length == 4) {
      theme_00 = color_theme_create();
      if (theme_00 == (color_theme *)0x0) {
        internal_logger(natwm_logger,LEVEL_ERROR,"Failed while allocating theme value");
        map_local._4_4_ = MEMORY_ALLOCATION_ERROR;
      }
      else {
        nVar1 = color_value_from_config_value(*pcStack_30->values,&theme_00->unfocused);
        if (nVar1 == NO_ERROR) {
          nVar1 = color_value_from_config_value(pcStack_30->values[1],&theme_00->focused);
          if (nVar1 == NO_ERROR) {
            nVar1 = color_value_from_config_value(pcStack_30->values[2],&theme_00->urgent);
            if (nVar1 == NO_ERROR) {
              nVar1 = color_value_from_config_value(pcStack_30->values[3],&theme_00->sticky);
              if (nVar1 == NO_ERROR) {
                config_value->length = (size_t)theme_00;
                return NO_ERROR;
              }
              internal_logger(natwm_logger,LEVEL_ERROR,"Invalid sticky color value found in \'%s\'",
                              result_local);
            }
            else {
              internal_logger(natwm_logger,LEVEL_ERROR,"Invalid urgent color value found in \'%s\'",
                              result_local);
            }
          }
          else {
            internal_logger(natwm_logger,LEVEL_ERROR,"Invalid focused color value found in \'%s\'",
                            result_local,in_R8,in_R9,uVar2);
          }
        }
        else {
          internal_logger(natwm_logger,LEVEL_ERROR,"Invalid unfocused color value found in \'%s\'",
                          result_local,in_R8,in_R9,uVar2);
        }
        color_theme_destroy(theme_00);
        map_local._4_4_ = INVALID_INPUT_ERROR;
      }
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,
                      "Invalid number of values for config item \'%s\', Expected 4",result_local,
                      in_R8,in_R9,uVar2);
      map_local._4_4_ = INVALID_INPUT_ERROR;
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to find config item for \'%s\'",result_local,
                    in_R8,in_R9,uVar2);
    map_local._4_4_ = nVar1;
  }
  return map_local._4_4_;
}

Assistant:

enum natwm_error color_theme_from_config(const struct map *map, const char *key,
                                         struct color_theme **result)
{
        const struct config_array *config_value = NULL;
        enum natwm_error err = config_find_array(map, key, &config_value);

        if (err != NO_ERROR) {
                if (NOT_FOUND_ERROR) {
                        LOG_ERROR(natwm_logger, "Failed to find config item for '%s'", key);
                } else {
                        LOG_ERROR(natwm_logger, "Invalid color values for config item '%s'", key);
                }

                return err;
        }

        // TODO: It might be better in the future to leave unset config values
        // as NULL and have a fallback. That way users could just override the
        // values they wanted to change.
        if (config_value->length != 4) {
                LOG_ERROR(natwm_logger,
                          "Invalid number of values for config item '%s', "
                          "Expected 4",
                          key);

                return INVALID_INPUT_ERROR;
        }

        struct color_theme *theme = color_theme_create();

        if (theme == NULL) {
                LOG_ERROR(natwm_logger, "Failed while allocating theme value");

                return MEMORY_ALLOCATION_ERROR;
        }

        err = color_value_from_config_value(config_value->values[0], &theme->unfocused);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Invalid unfocused color value found in '%s'", key);

                goto invalid_color_value_error;
        }

        err = color_value_from_config_value(config_value->values[1], &theme->focused);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Invalid focused color value found in '%s'", key);

                goto invalid_color_value_error;
        }

        err = color_value_from_config_value(config_value->values[2], &theme->urgent);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Invalid urgent color value found in '%s'", key);

                goto invalid_color_value_error;
        }

        err = color_value_from_config_value(config_value->values[3], &theme->sticky);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger, "Invalid sticky color value found in '%s'", key);

                goto invalid_color_value_error;
        }

        *result = theme;

        return NO_ERROR;

invalid_color_value_error:
        color_theme_destroy(theme);

        return INVALID_INPUT_ERROR;
}